

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# penguinv.cpp
# Opt level: O1

void penguinV::Subtract(Image *in1,uint32_t startX1,uint32_t startY1,Image *in2,uint32_t startX2,
                       uint32_t startY2,Image *out,uint32_t startXOut,uint32_t startYOut,
                       uint32_t width,uint32_t height)

{
  ImageTypeManager *pIVar1;
  bool bVar2;
  ImageTypeManager *this;
  FunctionTableHolder *pFVar3;
  SubtractForm4 func;
  uint8_t uVar4;
  undefined1 *puVar5;
  ImageManager manager;
  
  this = ImageTypeManager::instance();
  pFVar3 = ImageTypeManager::functionTable(this,in1->_type);
  func = pFVar3->Subtract;
  uVar4 = in1->_type;
  if (func == (SubtractForm4)0x0) {
    bVar2 = ImageTypeManager::isIntertypeConversionEnabled(this);
    if (bVar2) {
      ImageTypeManager::imageTypes
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&manager,this);
      if (manager._registrator ==
          (ImageTypeManager *)
          manager._input.
          super__Vector_base<(anonymous_namespace)::ConstReferenceOwner_*,_std::allocator<(anonymous_namespace)::ConstReferenceOwner_*>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        func = (SubtractForm4)0x0;
      }
      else {
        func = (SubtractForm4)0x0;
        pIVar1 = manager._registrator;
        do {
          puVar5 = &(pIVar1->_functionTableMap)._M_t._M_impl.field_0x1;
          pFVar3 = ImageTypeManager::functionTable
                             (this,*(uint8_t *)&(pIVar1->_functionTableMap)._M_t._M_impl);
          if (pFVar3->Subtract != (SubtractForm4)0x0) {
            uVar4 = *(uint8_t *)&(pIVar1->_functionTableMap)._M_t._M_impl;
            func = pFVar3->Subtract;
            break;
          }
          pIVar1 = (ImageTypeManager *)puVar5;
        } while ((pointer)puVar5 !=
                 manager._input.
                 super__Vector_base<(anonymous_namespace)::ConstReferenceOwner_*,_std::allocator<(anonymous_namespace)::ConstReferenceOwner_*>_>
                 ._M_impl.super__Vector_impl_data._M_start);
      }
      if (manager._registrator != (ImageTypeManager *)0x0) {
        operator_delete(manager._registrator);
      }
    }
    else {
      func = (SubtractForm4)0x0;
    }
  }
  (anonymous_namespace)::
  verifyFunction<void(*)(PenguinV_Image::ImageTemplate<unsigned_char>const&,unsigned_int,unsigned_int,PenguinV_Image::ImageTemplate<unsigned_char>const&,unsigned_int,unsigned_int,PenguinV_Image::ImageTemplate<unsigned_char>&,unsigned_int,unsigned_int,unsigned_int,unsigned_int)>
            ((_func_void_ImageTemplate<unsigned_char>_ptr_uint_uint_ImageTemplate<unsigned_char>_ptr_uint_uint_ImageTemplate<unsigned_char>_ptr_uint_uint_uint_uint
              *)func,"Subtract");
  manager._registrator = ImageTypeManager::instance();
  manager._input.
  super__Vector_base<(anonymous_namespace)::ConstReferenceOwner_*,_std::allocator<(anonymous_namespace)::ConstReferenceOwner_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  manager._input.
  super__Vector_base<(anonymous_namespace)::ConstReferenceOwner_*,_std::allocator<(anonymous_namespace)::ConstReferenceOwner_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  manager._input.
  super__Vector_base<(anonymous_namespace)::ConstReferenceOwner_*,_std::allocator<(anonymous_namespace)::ConstReferenceOwner_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  manager._output.
  super__Vector_base<(anonymous_namespace)::ReferenceOwner_*,_std::allocator<(anonymous_namespace)::ReferenceOwner_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  manager._output.
  super__Vector_base<(anonymous_namespace)::ReferenceOwner_*,_std::allocator<(anonymous_namespace)::ReferenceOwner_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  manager._output.
  super__Vector_base<(anonymous_namespace)::ReferenceOwner_*,_std::allocator<(anonymous_namespace)::ReferenceOwner_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  manager._inputClone.
  super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  manager._inputClone.
  super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  manager._inputClone.
  super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  manager._outputClone.
  super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  manager._outputClone.
  super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  manager._outputClone.
  super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  manager._type = uVar4;
  (*func)(in1,startX1,startY1,in2,startX2,startY2,out,startXOut,startYOut,width,height);
  anon_unknown.dwarf_3f24d::ImageManager::~ImageManager(&manager);
  return;
}

Assistant:

void Subtract( const Image & in1, uint32_t startX1, uint32_t startY1, const Image & in2, uint32_t startX2, uint32_t startY2,
                   Image & out, uint32_t startXOut, uint32_t startYOut, uint32_t width, uint32_t height )
    {
        initialize( in1, Subtract )
        func( in1, startX1, startY1, in2, startX2, startY2, out, startXOut, startYOut, width, height );
    }